

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall asl::Socket_::skip(Socket_ *this,int n)

{
  int *piVar1;
  uchar *in_RAX;
  ByteArray a;
  Array<unsigned_char> local_18;
  
  local_18._a = in_RAX;
  Array<unsigned_char>::alloc(&local_18,n);
  (*(this->super_SmartObject_)._vptr_SmartObject_[0xd])
            (this,local_18._a,(ulong)*(uint *)(local_18._a + -0x10));
  LOCK();
  piVar1 = (int *)(local_18._a + -8);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    free(local_18._a + -0x10);
  }
  return;
}

Assistant:

void Socket_::skip(int n)
{
	ByteArray a(n);
	read(a.data(), a.length());
}